

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdspnm.cpp
# Opt level: O0

void __thiscall icu_63::ICUDataTable::ICUDataTable(ICUDataTable *this,char *path,Locale *locale)

{
  Locale *other;
  size_t sVar1;
  char *pcVar2;
  int32_t len;
  Locale *locale_local;
  char *path_local;
  ICUDataTable *this_local;
  
  this->path = (char *)0x0;
  other = Locale::getRoot();
  Locale::Locale(&this->locale,other);
  if (path != (char *)0x0) {
    sVar1 = strlen(path);
    pcVar2 = (char *)uprv_malloc_63((long)((int)sVar1 + 1));
    this->path = pcVar2;
    if (this->path != (char *)0x0) {
      strcpy(this->path,path);
      Locale::operator=(&this->locale,locale);
    }
  }
  return;
}

Assistant:

ICUDataTable::ICUDataTable(const char* path, const Locale& locale)
    : path(NULL), locale(Locale::getRoot())
{
  if (path) {
    int32_t len = static_cast<int32_t>(uprv_strlen(path));
    this->path = (const char*) uprv_malloc(len + 1);
    if (this->path) {
      uprv_strcpy((char *)this->path, path);
      this->locale = locale;
    }
  }
}